

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test2::testBegin
          (GPUShaderFP64Test2 *this,GLuint program_id,shaderStage shader_stage)

{
  pointer piVar1;
  ostringstream *this_00;
  char *pcVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  size_t sVar6;
  TestError *pTVar7;
  long lVar8;
  GLenum type;
  GLsizei size;
  vector<int,_std::allocator<int>_> buffer_data;
  GLchar name [16];
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  long lVar5;
  
  buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  std::vector<int,_std::allocator<int>_>::resize(&buffer_data,0x400);
  lVar8 = 0;
  do {
    piVar1 = buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar8;
    *piVar1 = 2;
    piVar1[1] = 2;
    piVar1[2] = 2;
    piVar1[3] = 2;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x400);
  if (shader_stage - GEOMETRY_SHADER < 4) {
    size = 0;
    type = 0;
    (**(code **)(lVar5 + 0xb18))(program_id,0,0x10,0,&size,&type,name);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"GetTransformFeedbackVarying",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1105);
    if (((size != 1) || (type != 0x1404)) ||
       (CONCAT31(name._4_3_,name[3]) != 0x746c75 || name._0_4_ != 0x75736572)) {
      local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Error. Invalid GetTransformFeedbackVarying results.",0x33);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Size: ",7);
      std::ostream::operator<<(this_00,size);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," expected: ",0xb);
      std::ostream::operator<<(this_00,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Type: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," expected: ",0xb);
      std::ostream::operator<<(this_00,0x1404);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Name: ",8);
      sVar6 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,name,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," expected: result",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_128);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid GetTransformFeedbackVarying results",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x110e);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1114);
    (**(code **)(lVar5 + 0x150))
              (0x8c8e,0x1000,
               buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88ea);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"BufferData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1117);
    (**(code **)(lVar5 + 0x50))(0x8c8e,0,this->m_transform_feedback_buffer_id,0,0x1000);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"BindBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x111c);
    (**(code **)(lVar5 + 0x30))(0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x111f;
    pcVar2 = "glBeginTransformFeedback";
  }
  else {
    if (shader_stage == COMPUTE_SHADER) {
      (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texture_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x113d);
      (**(code **)(lVar5 + 0x13b8))
                (0xde1,0,0,0,0x20,0x20,0x8d94,0x1404,
                 buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"TexSubImage2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x1141);
      iVar3 = (**(code **)(lVar5 + 0xb48))(program_id,"result");
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"TexSubImage2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x1144);
      if (iVar3 == -1) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Inactive uniform \"result\"",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x1148);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar5 + 0x14f0))(iVar3,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"TexSubImage2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x114c);
      (**(code **)(lVar5 + 0x80))(0,this->m_texture_id,0,0,0,0x88b9,0x8235);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"BindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x1151);
      goto LAB_00922427;
    }
    if (shader_stage != FRAGMENT_SHADER) goto LAB_00922427;
    (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texture_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1127);
    (**(code **)(lVar5 + 0x13b8))
              (0xde1,0,0,0,0x20,0x20,0x8d94,0x1404,
               buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"TexSubImage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x112b);
    (**(code **)(lVar5 + 0x78))(0x8ca9,this->m_framebuffer_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x112f);
    (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_texture_id,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"FramebufferTexture2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1132);
    (**(code **)(lVar5 + 0x1a00))(0,0,0x20,0x20);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x1135;
    pcVar2 = "glViewport";
  }
  glu::checkError(dVar4,pcVar2 + 2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,iVar3);
LAB_00922427:
  if (buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GPUShaderFP64Test2::testBegin(glw::GLuint program_id, shaderStage shader_stage) const
{
	std::vector<glw::GLint> buffer_data;
	const glw::GLenum		captured_primitive = getCapturedPrimitiveType(shader_stage);
	const glw::Functions&   gl				   = m_context.getRenderContext().getFunctions();

	/* Prepare buffer filled with m_result_failure */
	buffer_data.resize(m_n_captured_results);
	for (glw::GLuint i = 0; i < m_n_captured_results; ++i)
	{
		buffer_data[i] = m_result_failure;
	}

	/* Prepare buffer for test results */
	switch (shader_stage)
	{
	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
	case VERTEX_SHADER:

		/* Verify getTransformFeedbackVarying results */
		{
			glw::GLsizei size = 0;
			glw::GLenum  type = 0;
			glw::GLchar  name[16];

			gl.getTransformFeedbackVarying(program_id, 0 /* index */, 16 /* bufSize */, 0 /* length */, &size, &type,
										   name);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetTransformFeedbackVarying");

			if ((1 != size) || (GL_INT != type) || (0 != strcmp("result", name)))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Error. Invalid GetTransformFeedbackVarying results."
					<< " Size: " << size << " expected: " << 1 << ". Type: " << type << " expected: " << GL_INT
					<< ". Name: " << name << " expected: result" << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid GetTransformFeedbackVarying results");
			}
		}

		/* Create/clean transform feedback buffer */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_size, &buffer_data[0], GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

		/* Set up transform feedback buffer */
		gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_transform_feedback_buffer_id, 0 /* offset */,
						   m_transform_feedback_buffer_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

		gl.beginTransformFeedback(captured_primitive);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

		break;

	case FRAGMENT_SHADER:

		/* Clean texture */
		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texSubImage2D(GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, m_texture_width, m_texture_height,
						 GL_RED_INTEGER, GL_INT, &buffer_data[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		/* Set up texture as color attachment 0 */
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_framebuffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture_id, 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

		gl.viewport(0 /* x */, 0 /* y */, m_texture_width, m_texture_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

		break;

	case COMPUTE_SHADER:

		/* Clean texture */
		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texSubImage2D(GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, m_texture_width, m_texture_height,
						 GL_RED_INTEGER, GL_INT, &buffer_data[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		glw::GLint location = gl.getUniformLocation(program_id, "result");
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		if (-1 == location)
		{
			TCU_FAIL("Inactive uniform \"result\"");
		}

		gl.uniform1i(location, 0 /* first image unit */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		/* Bind texture to first image unit */
		gl.bindImageTexture(0 /* first image unit */, m_texture_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32I);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		break;
	}
}